

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O0

void phyr::latinHypercube(double *sample,int nSamples,int nDimensions,RNG *rng)

{
  uint32_t uVar1;
  double *pdVar2;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double dVar3;
  int swapIdx;
  int j_1;
  int i_1;
  double offset;
  int j;
  int i;
  double invSamples;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar4;
  double in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int local_38;
  int local_34;
  double local_30;
  int local_28;
  int local_24;
  double local_20;
  int local_10;
  int local_c;
  long local_8;
  
  local_20 = 1.0 / (double)in_ESI;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  for (local_24 = 0; local_24 < local_c; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < local_10; local_28 = local_28 + 1) {
      in_stack_ffffffffffffffb8 = (double)local_24;
      dVar3 = RNG::uniformReal((RNG *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0))
      ;
      local_30 = (in_stack_ffffffffffffffb8 + dVar3) * local_20;
      pdVar2 = std::min<double>(&local_30,(double *)&OneMinusEpsilon);
      *(double *)(local_8 + (long)(local_10 * local_24 + local_28) * 8) = *pdVar2;
    }
  }
  for (local_34 = 0; local_34 < local_10; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < local_c; local_38 = local_38 + 1) {
      iVar4 = local_38;
      uVar1 = RNG::uniformUInt32((RNG *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0
                                                ),
                                 (uint32_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      in_stack_ffffffffffffffc4 = iVar4 + uVar1;
      std::swap<double>((double *)(local_8 + (long)(local_10 * local_38 + local_34) * 8),
                        (double *)
                        (local_8 + (long)(local_10 * in_stack_ffffffffffffffc4 + local_34) * 8));
    }
  }
  return;
}

Assistant:

void latinHypercube(Real* sample, int nSamples, int nDimensions, RNG& rng) {
    // Generate LHS samples along the diagonal
    Real invSamples = Real(1) / nSamples;
    for (int i = 0; i < nSamples; i++) {
        for (int j = 0; j < nDimensions; j++) {
            Real offset = (i + rng.uniformReal()) * invSamples;
            sample[nDimensions * i + j] = std::min(offset, OneMinusEpsilon);
        }
    }

    // Permute LHS samples in each dimension
    for (int i = 0; i < nDimensions; i++) {
        for (int j = 0; j < nSamples; j++) {
            int swapIdx = j + rng.uniformUInt32(nSamples - j);
            std::swap(sample[nDimensions * j + i], sample[nDimensions * swapIdx + i]);
        }
    }
}